

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSpecialFont::LoadTranslations(FSpecialFont *this)

{
  FFontChar1 *this_00;
  double *luminosity_00;
  int iVar1;
  TranslationParm *ranges;
  FRemapTable *pFVar2;
  FRemapTable *remap;
  FFontChar1 *pic;
  int local_228;
  int j;
  int i;
  int TotalColors;
  double *luminosity;
  BYTE identity [256];
  BYTE usedcolors [256];
  int count;
  FSpecialFont *this_local;
  
  iVar1 = ((this->super_FFont).LastChar - (this->super_FFont).FirstChar) + 1;
  memset(identity + 0xf8,0,0x100);
  for (local_228 = 0; local_228 < iVar1; local_228 = local_228 + 1) {
    this_00 = (FFontChar1 *)(this->super_FFont).Chars[local_228].Pic;
    if (this_00 != (FFontChar1 *)0x0) {
      FFontChar1::SetSourceRemap(this_00,(BYTE *)0x0);
      RecordTextureColors((FTexture *)this_00,identity + 0xf8);
    }
  }
  for (local_228 = 0; local_228 < 0x100; local_228 = local_228 + 1) {
    if ((this->notranslate[local_228] & 1U) != 0) {
      identity[(long)local_228 + 0xf8] = '\0';
    }
  }
  j = FFont::SimpleTranslation
                (identity + 0xf8,(this->super_FFont).PatchRemap,(BYTE *)&luminosity,(double **)&i);
  (this->super_FFont).ActiveColors = j;
  for (local_228 = 0; local_228 < 0x100; local_228 = local_228 + 1) {
    if ((this->notranslate[local_228] & 1U) != 0) {
      (this->super_FFont).PatchRemap[local_228] = (BYTE)j;
      identity[(long)j + -8] = (BYTE)local_228;
      j = j + 1;
    }
  }
  for (local_228 = 0; luminosity_00 = _i, local_228 < iVar1; local_228 = local_228 + 1) {
    if ((this->super_FFont).Chars[local_228].Pic != (FTexture *)0x0) {
      FFontChar1::SetSourceRemap
                ((FFontChar1 *)(this->super_FFont).Chars[local_228].Pic,
                 (this->super_FFont).PatchRemap);
    }
  }
  ranges = TArray<TranslationParm,_TranslationParm>::operator[](TranslationParms,0);
  FFont::BuildTranslations
            (&this->super_FFont,luminosity_00,(BYTE *)&luminosity,ranges,j,(PalEntry *)0x0);
  if ((this->super_FFont).ActiveColors < j) {
    for (local_228 = 0; local_228 < NumTextColors; local_228 = local_228 + 1) {
      pFVar2 = TArray<FRemapTable,_FRemapTable>::operator[]
                         (&(this->super_FFont).Ranges,(long)local_228);
      for (pic._4_4_ = (this->super_FFont).ActiveColors; pic._4_4_ < j; pic._4_4_ = pic._4_4_ + 1) {
        pFVar2->Remap[pic._4_4_] = identity[(long)pic._4_4_ + -8];
        pFVar2->Palette[pic._4_4_].field_0 =
             GPalette.BaseColors[identity[(long)pic._4_4_ + -8]].field_0;
        pFVar2->Palette[pic._4_4_].field_0.field_0.a = 0xff;
      }
    }
  }
  (this->super_FFont).ActiveColors = j;
  if (_i != (double *)0x0) {
    operator_delete__(_i);
  }
  return;
}

Assistant:

void FSpecialFont::LoadTranslations()
{
	int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;
	int TotalColors;
	int i, j;

	memset (usedcolors, 0, 256);
	for (i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	// exclude the non-translated colors from the translation calculation
	for (i = 0; i < 256; i++)
		if (notranslate[i])
			usedcolors[i] = false;

	TotalColors = ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	// Map all untranslated colors into the table of used colors
	for (i = 0; i < 256; i++) 
	{
		if (notranslate[i])
		{
			PatchRemap[i] = TotalColors;
			identity[TotalColors] = i;
			TotalColors++;
		}
	}

	for (i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], TotalColors, NULL);

	// add the untranslated colors to the Ranges tables
	if (ActiveColors < TotalColors)
	{
		for (i = 0; i < NumTextColors; i++)
		{
			FRemapTable *remap = &Ranges[i];
			for (j = ActiveColors; j < TotalColors; ++j)
			{
				remap->Remap[j] = identity[j];
				remap->Palette[j] = GPalette.BaseColors[identity[j]];
				remap->Palette[j].a = 0xff;
			}
		}
	}
	ActiveColors = TotalColors;

	delete[] luminosity;
}